

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ini_file::line_exist(xr_ini_file *this,char *sname,char *lname)

{
  bool bVar1;
  int iVar2;
  char *s1;
  reference ppiVar3;
  bool bVar4;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_50;
  ini_section_pred local_48;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_40;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_38;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_30;
  ini_section_vec_cit it;
  char *lname_local;
  char *sname_local;
  xr_ini_file *this_local;
  
  it._M_current = (ini_section **)lname;
  local_38._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::begin(&this->m_sections);
  local_40._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::end(&this->m_sections);
  ini_section_pred::ini_section_pred(&local_48,sname);
  local_30 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                       (local_38,local_40,local_48);
  local_50._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::end(&this->m_sections);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_50);
  bVar4 = true;
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
    ::operator*(&local_30);
    s1 = (char *)std::__cxx11::string::c_str();
    iVar2 = xr_stricmp(s1,sname);
    bVar4 = iVar2 != 0;
  }
  if (bVar4) {
    this_local._7_1_ = false;
  }
  else {
    ppiVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
              ::operator*(&local_30);
    this_local._7_1_ = ini_section::line_exist(*ppiVar3,(char *)it._M_current,(char **)0x0);
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ini_file::line_exist(const char* sname, const char* lname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0)
		return false;
	return (*it)->line_exist(lname, 0);
}